

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

void __thiscall IZDeflate::gen_bitlen(IZDeflate *this,tree_desc *desc)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ct_data *pcVar6;
  int *piVar7;
  ct_data *pcVar8;
  uint uVar9;
  int local_5c;
  int overflow;
  uint uStack_50;
  ush f;
  int xbits;
  int bits;
  int m;
  int n;
  int h;
  ct_data *stree;
  int max_length;
  int max_code;
  int base;
  int *extra;
  ct_data *tree;
  tree_desc *desc_local;
  IZDeflate *this_local;
  
  pcVar6 = desc->dyn_tree;
  piVar7 = desc->extra_bits;
  iVar2 = desc->extra_base;
  iVar3 = desc->max_code;
  uVar4 = desc->max_length;
  pcVar8 = desc->static_tree;
  local_5c = 0;
  for (uStack_50 = 0; (int)uStack_50 < 0x10; uStack_50 = uStack_50 + 1) {
    this->bl_count[(int)uStack_50] = 0;
  }
  pcVar6[this->heap[this->heap_max]].dl.dad = 0;
  m = this->heap_max;
  while (m = m + 1, m < 0x23d) {
    iVar5 = this->heap[m];
    uStack_50 = pcVar6[pcVar6[iVar5].dl.dad].dl.dad + 1;
    if ((int)uVar4 < (int)uStack_50) {
      local_5c = local_5c + 1;
      uStack_50 = uVar4;
    }
    pcVar6[iVar5].dl.dad = (ush)uStack_50;
    if (iVar5 <= iVar3) {
      this->bl_count[(int)uStack_50] = this->bl_count[(int)uStack_50] + 1;
      overflow = 0;
      if (iVar2 <= iVar5) {
        overflow = piVar7[iVar5 - iVar2];
      }
      uVar1 = pcVar6[iVar5].fc.freq;
      this->opt_len = (ulong)uVar1 * (long)(int)(uStack_50 + overflow) + this->opt_len;
      if (pcVar8 != (ct_data *)0x0) {
        this->static_len =
             (ulong)uVar1 * (long)(int)((uint)pcVar8[iVar5].dl.dad + overflow) + this->static_len;
      }
    }
  }
  uStack_50 = uVar4;
  if (local_5c != 0) {
    do {
      do {
        uVar9 = uStack_50;
        uStack_50 = uVar9 - 1;
      } while (this->bl_count[(int)uStack_50] == 0);
      this->bl_count[(int)uStack_50] = this->bl_count[(int)uStack_50] - 1;
      this->bl_count[(int)uVar9] = this->bl_count[(int)uVar9] + 2;
      this->bl_count[(int)uVar4] = this->bl_count[(int)uVar4] - 1;
      local_5c = local_5c + -2;
      uStack_50 = uVar4;
    } while (0 < local_5c);
    for (; uStack_50 != 0; uStack_50 = uStack_50 - 1) {
      bits = (int)this->bl_count[(int)uStack_50];
      while (bits != 0) {
        m = m + -1;
        iVar2 = this->heap[m];
        if (iVar2 <= iVar3) {
          if ((uint)pcVar6[iVar2].dl.dad != (uStack_50 & 0xffff)) {
            this->opt_len =
                 ((long)(int)uStack_50 - (ulong)pcVar6[iVar2].dl.dad) * (ulong)pcVar6[iVar2].fc.freq
                 + this->opt_len;
            pcVar6[iVar2].dl.dad = (ush)uStack_50;
          }
          bits = bits + -1;
        }
      }
    }
  }
  return;
}

Assistant:

void IZDeflate::gen_bitlen(tree_desc near *desc)
    // tree_desc near *desc; /* the tree descriptor */
{
    ct_data near *tree  = desc->dyn_tree;
    int near *extra     = desc->extra_bits;
    int base            = desc->extra_base;
    int max_code        = desc->max_code;
    int max_length      = desc->max_length;
    ct_data near *stree = desc->static_tree;
    int h;              /* heap index */
    int n, m;           /* iterate over the tree elements */
    int bits;           /* bit length */
    int xbits;          /* extra bits */
    ush f;              /* frequency */
    int overflow = 0;   /* number of elements with bit length too large */

    for (bits = 0; bits <= MAX_BITS; bits++) bl_count[bits] = 0;

    /* In a first pass, compute the optimal bit lengths (which may
     * overflow in the case of the bit length tree).
     */
    tree[heap[heap_max]].Len = 0; /* root of the heap */

    for (h = heap_max+1; h < HEAP_SIZE; h++) {
        n = heap[h];
        bits = tree[tree[n].Dad].Len + 1;
        if (bits > max_length) bits = max_length, overflow++;
        tree[n].Len = (ush)bits;
        /* We overwrite tree[n].Dad which is no longer needed */

        if (n > max_code) continue; /* not a leaf node */

        bl_count[bits]++;
        xbits = 0;
        if (n >= base) xbits = extra[n-base];
        f = tree[n].Freq;
        opt_len += (ulg)f * (bits + xbits);
        if (stree) static_len += (ulg)f * (stree[n].Len + xbits);
    }
    if (overflow == 0) return;

    Trace((stderr,"\nbit length overflow\n"));
    /* This happens for example on obj2 and pic of the Calgary corpus */

    /* Find the first bit length which could increase: */
    do {
        bits = max_length-1;
        while (bl_count[bits] == 0) bits--;
        bl_count[bits]--;           /* move one leaf down the tree */
        bl_count[bits+1] += (ush)2; /* move one overflow item as its brother */
        bl_count[max_length]--;
        /* The brother of the overflow item also moves one step up,
         * but this does not affect bl_count[max_length]
         */
        overflow -= 2;
    } while (overflow > 0);

    /* Now recompute all bit lengths, scanning in increasing frequency.
     * h is still equal to HEAP_SIZE. (It is simpler to reconstruct all
     * lengths instead of fixing only the wrong ones. This idea is taken
     * from 'ar' written by Haruhiko Okumura.)
     */
    for (bits = max_length; bits != 0; bits--) {
        n = bl_count[bits];
        while (n != 0) {
            m = heap[--h];
            if (m > max_code) continue;
            if (tree[m].Len != (ush)bits) {
                Trace((stderr,"code %d bits %d->%d\n", m, tree[m].Len, bits));
                opt_len += ((long)bits-(long)tree[m].Len)*(long)tree[m].Freq;
                tree[m].Len = (ush)bits;
            }
            n--;
        }
    }
}